

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void vkt::memory::anon_unknown_0::queueRun
               (DeviceInterface *vkd,VkQueue queue,VkCommandBuffer commandBuffer)

{
  VkResult VVar1;
  Handle<(vk::HandleType)6> local_70;
  undefined4 local_68 [2];
  VkSubmitInfo submitInfo;
  VkCommandBuffer commandBuffer_local;
  VkQueue queue_local;
  DeviceInterface *vkd_local;
  
  submitInfo.pSignalSemaphores = (VkSemaphore *)commandBuffer;
  memset(local_68,0,0x48);
  local_68[0] = 4;
  submitInfo.pWaitDstStageMask._0_4_ = 1;
  submitInfo._40_8_ = &submitInfo.pSignalSemaphores;
  ::vk::Handle<(vk::HandleType)6>::Handle(&local_70,0);
  VVar1 = (*vkd->_vptr_DeviceInterface[2])(vkd,queue,1,local_68,local_70.m_internal);
  ::vk::checkResult(VVar1,"vkd.queueSubmit(queue, 1, &submitInfo, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2a8);
  VVar1 = (*vkd->_vptr_DeviceInterface[3])(vkd,queue);
  ::vk::checkResult(VVar1,"vkd.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2a9);
  return;
}

Assistant:

void queueRun (const vk::DeviceInterface&	vkd,
			   vk::VkQueue					queue,
			   vk::VkCommandBuffer			commandBuffer)
{
	const vk::VkSubmitInfo	submitInfo	=
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,

		0,
		DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,

		1,
		&commandBuffer,

		0,
		DE_NULL
	};

	VK_CHECK(vkd.queueSubmit(queue, 1, &submitInfo, 0));
	VK_CHECK(vkd.queueWaitIdle(queue));
}